

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

ssize_t __thiscall
booster::locale::basic_message<wchar_t>::write
          (basic_message<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  wchar_t *pwVar2;
  char_type_conflict *pcVar3;
  wchar_t *pwVar4;
  char_type_conflict *msg;
  facet_type *facet;
  char_type_conflict *plural;
  char_type_conflict *context;
  char_type_conflict *id;
  char_type_conflict *translated;
  basic_message<wchar_t> *in_stack_ffffffffffffff88;
  basic_message<wchar_t> *in_stack_ffffffffffffff90;
  wchar_t *msg_00;
  message_format<wchar_t> *pmVar5;
  wchar_t *local_30;
  wchar_t *local_8;
  
  local_30 = (wchar_t *)0x0;
  pwVar2 = basic_message<wchar_t>::id(in_stack_ffffffffffffff90);
  pcVar3 = basic_message<wchar_t>::context(in_stack_ffffffffffffff88);
  pwVar4 = basic_message<wchar_t>::plural(in_stack_ffffffffffffff88);
  if (*pwVar2 == L'\0') {
    local_8 = write::empty_string;
  }
  else {
    pmVar5 = (message_format<wchar_t> *)0x0;
    bVar1 = std::has_facet<booster::locale::message_format<wchar_t>>((locale *)0x0);
    if (bVar1) {
      pmVar5 = std::use_facet<booster::locale::message_format<wchar_t>>((locale *)this);
    }
    if (pmVar5 != (message_format<wchar_t> *)0x0) {
      if (pwVar4 == (wchar_t *)0x0) {
        local_30 = (wchar_t *)
                   (**(code **)(*(long *)pmVar5 + 0x10))
                             (pmVar5,(ulong)__buf & 0xffffffff,pcVar3,pwVar2);
      }
      else {
        local_30 = (wchar_t *)
                   (**(code **)(*(long *)pmVar5 + 0x18))
                             (pmVar5,(ulong)__buf & 0xffffffff,pcVar3,pwVar2,this->n_);
      }
    }
    if (local_30 == (wchar_t *)0x0) {
      msg_00 = pwVar2;
      if ((pwVar4 != (wchar_t *)0x0) && (msg_00 = pwVar4, this->n_ == 1)) {
        msg_00 = pwVar2;
      }
      if (pmVar5 == (message_format<wchar_t> *)0x0) {
        local_30 = details::string_cast_traits<wchar_t>::cast
                             (msg_00,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                      *)__n);
      }
      else {
        local_30 = (wchar_t *)(**(code **)(*(long *)pmVar5 + 0x28))(pmVar5,msg_00,__n);
      }
    }
    local_8 = local_30;
  }
  return (ssize_t)local_8;
}

Assistant:

char_type const *write(std::locale const &loc,int domain_id,string_type &buffer) const
            {
                char_type const *translated = 0;
                static const char_type empty_string[1] = {0};

                char_type const *id = this->id();
                char_type const *context = this->context();
                char_type const *plural = this->plural();
                
                if(*id == 0)
                    return empty_string;
                
                facet_type const *facet = 0;
                if(std::has_facet<facet_type>(loc))
                    facet = &std::use_facet<facet_type>(loc);

                if(facet) { 
                    if(!plural) {
                        translated = facet->get(domain_id,context,id);
                    }
                    else {
                        translated = facet->get(domain_id,context,id,n_);
                    }
                }

                if(!translated) {
                    char_type const *msg = plural ? ( n_ == 1 ? id : plural) : id;

                    if(facet) {
                        translated = facet->convert(msg,buffer);
                    }
                    else {
                        translated = details::string_cast_traits<char_type>::cast(msg,buffer);
                    }
                }
                return translated;
            }